

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

int sendMessage(string *cmd,int socket_fd,string *currUser)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  ostream *poVar4;
  ssize_t sVar5;
  long *plVar6;
  long *__buf;
  long *local_70;
  long local_60;
  long lStack_58;
  size_type *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  local_50 = &__str._M_string_length;
  pcVar1 = (currUser->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + currUser->_M_string_length);
  std::__cxx11::string::append((char *)&local_50);
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)(cmd->_M_dataplus)._M_p)
  ;
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar3;
  }
  lVar2 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_70,lVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_50 != &__str._M_string_length) {
    operator_delete(local_50);
  }
  local_50 = &__str._M_string_length;
  pcVar1 = (currUser->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + currUser->_M_string_length);
  std::__cxx11::string::append((char *)&local_50);
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)(cmd->_M_dataplus)._M_p)
  ;
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar3[3];
    __buf = &local_60;
  }
  else {
    local_60 = *plVar6;
    __buf = (long *)*plVar3;
  }
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  sVar5 = send(socket_fd,__buf,0xff,0);
  if (__buf != &local_60) {
    operator_delete(__buf);
  }
  if (local_50 != &__str._M_string_length) {
    operator_delete(local_50);
  }
  if (sVar5 == -1) {
    perror("send");
  }
  return 1;
}

Assistant:

int sendMessage(string cmd, int socket_fd, const string& currUser){

    cout << currUser + ": " + cmd << endl;
    if(send(socket_fd,(currUser + ": " + cmd).c_str(), MAXDATASIZE -1, 0) == -1)
        perror("send");

    return 1;
}